

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS JlUnmarshallFreeStructAllocs
                    (JlMarshallElement *StructDescription,size_t StructDescriptionCount,
                    void *Structure)

{
  undefined4 local_24;
  JL_STATUS jlStatus;
  void *Structure_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  
  if (((StructDescription == (JlMarshallElement *)0x0) || (StructDescriptionCount == 0)) ||
     (Structure == (void *)0x0)) {
    local_24 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    local_24 = FreeUnmarshalledDictionary(StructDescription,StructDescriptionCount,Structure);
  }
  return local_24;
}

Assistant:

JL_STATUS
    JlUnmarshallFreeStructAllocs
    (
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        void*                       Structure
    )
{
    JL_STATUS jlStatus;

    if(     NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        jlStatus = FreeUnmarshalledDictionary( StructDescription, StructDescriptionCount, Structure );
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}